

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

bool __thiscall
cmGeneratorTarget::ComputePDBOutputDir
          (cmGeneratorTarget *this,string *kind,string *config,string *out)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  size_t __n;
  size_type sVar4;
  cmGlobalGenerator *pcVar5;
  int iVar6;
  cmValue cVar7;
  string *in_base;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string local_158;
  string conf;
  string local_118;
  string configProp;
  string local_d8;
  char *local_b8;
  undefined8 local_b0;
  size_type local_a8;
  pointer local_a0;
  undefined8 local_98;
  string local_90;
  string configUpper;
  string propertyName;
  
  paVar1 = &propertyName.field_2;
  propertyName._M_string_length = 0;
  propertyName.field_2._M_local_buf[0] = '\0';
  propertyName._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)kind->_M_string_length !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    local_d8._M_string_length = (size_type)(kind->_M_dataplus)._M_p;
    local_d8.field_2._M_allocated_capacity = 0;
    local_d8.field_2._8_8_ = 0x11;
    local_b8 = "_OUTPUT_DIRECTORY";
    local_b0 = 0;
    views._M_len = 2;
    views._M_array = (iterator)&local_d8;
    local_d8._M_dataplus._M_p = (pointer)kind->_M_string_length;
    cmCatViews(&conf,views);
    std::__cxx11::string::operator=((string *)&propertyName,(string *)&conf);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)conf._M_dataplus._M_p != &conf.field_2) {
      operator_delete(conf._M_dataplus._M_p,conf.field_2._M_allocated_capacity + 1);
    }
  }
  conf._M_dataplus._M_p = (pointer)&conf.field_2;
  pcVar3 = (config->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&conf,pcVar3,pcVar3 + config->_M_string_length);
  cmsys::SystemTools::UpperCase(&configUpper,&conf);
  configProp._M_dataplus._M_p = (pointer)&configProp.field_2;
  configProp._M_string_length = 0;
  configProp.field_2._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)kind->_M_string_length !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    local_d8._M_string_length = (size_type)(kind->_M_dataplus)._M_p;
    local_d8.field_2._M_allocated_capacity = 0;
    local_d8.field_2._8_8_ = 0x12;
    local_b8 = "_OUTPUT_DIRECTORY_";
    local_b0 = 0;
    local_a8 = configUpper._M_string_length;
    local_a0 = configUpper._M_dataplus._M_p;
    local_98 = 0;
    views_00._M_len = 3;
    views_00._M_array = (iterator)&local_d8;
    local_d8._M_dataplus._M_p = (pointer)kind->_M_string_length;
    cmCatViews(&local_158,views_00);
    std::__cxx11::string::operator=((string *)&configProp,(string *)&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,
                      CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                               local_158.field_2._M_local_buf[0]) + 1);
    }
  }
  cVar7 = GetProperty(this,&configProp);
  if (cVar7.Value == (string *)0x0) {
    cVar7 = GetProperty(this,&propertyName);
    if (cVar7.Value == (string *)0x0) goto LAB_00606dd7;
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    pcVar3 = ((cVar7.Value)->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_118,pcVar3,pcVar3 + (cVar7.Value)->_M_string_length);
    local_158._M_string_length = 0;
    local_158.field_2._M_local_buf[0] = '\0';
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    cmGeneratorExpression::Evaluate
              (&local_d8,&local_118,this->LocalGenerator,config,(cmGeneratorTarget *)0x0,
               (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,&local_158);
    std::__cxx11::string::operator=((string *)out,(string *)&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,
                      CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                               local_158.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    __n = out->_M_string_length;
    if (__n == (cVar7.Value)->_M_string_length) {
      if (__n == 0) goto LAB_00606dd7;
      iVar6 = bcmp((out->_M_dataplus)._M_p,((cVar7.Value)->_M_dataplus)._M_p,__n);
      if (iVar6 == 0) goto LAB_00606dd7;
    }
  }
  else {
    pcVar3 = ((cVar7.Value)->_M_dataplus)._M_p;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar3,pcVar3 + (cVar7.Value)->_M_string_length);
    local_158._M_string_length = 0;
    local_158.field_2._M_local_buf[0] = '\0';
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    cmGeneratorExpression::Evaluate
              (&local_d8,&local_90,this->LocalGenerator,config,(cmGeneratorTarget *)0x0,
               (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,&local_158);
    std::__cxx11::string::operator=((string *)out,(string *)&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,
                      CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                               local_158.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
  }
  conf._M_string_length = 0;
  *conf._M_dataplus._M_p = '\0';
LAB_00606dd7:
  sVar4 = out->_M_string_length;
  if (sVar4 != 0) {
    in_base = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this->LocalGenerator);
    cmsys::SystemTools::CollapseFullPath(&local_d8,out,in_base);
    std::__cxx11::string::operator=((string *)out,(string *)&local_d8);
    paVar2 = &local_d8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if (conf._M_string_length != 0) {
      pcVar5 = this->LocalGenerator->GlobalGenerator;
      local_d8.field_2._M_allocated_capacity._0_2_ = 0x2f;
      local_d8._M_string_length = (size_type)&DAT_00000001;
      local_158._M_string_length = 0;
      local_158.field_2._M_local_buf[0] = '\0';
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      local_d8._M_dataplus._M_p = (pointer)paVar2;
      (*pcVar5->_vptr_cmGlobalGenerator[0x1a])(pcVar5,&local_d8,&conf,&local_158,out);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,
                        CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                                 local_158.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != paVar2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)configProp._M_dataplus._M_p != &configProp.field_2) {
    operator_delete(configProp._M_dataplus._M_p,
                    CONCAT71(configProp.field_2._M_allocated_capacity._1_7_,
                             configProp.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)configUpper._M_dataplus._M_p != &configUpper.field_2) {
    operator_delete(configUpper._M_dataplus._M_p,configUpper.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)conf._M_dataplus._M_p != &conf.field_2) {
    operator_delete(conf._M_dataplus._M_p,conf.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)propertyName._M_dataplus._M_p != paVar1) {
    operator_delete(propertyName._M_dataplus._M_p,
                    CONCAT71(propertyName.field_2._M_allocated_capacity._1_7_,
                             propertyName.field_2._M_local_buf[0]) + 1);
  }
  return sVar4 != 0;
}

Assistant:

bool cmGeneratorTarget::ComputePDBOutputDir(const std::string& kind,
                                            const std::string& config,
                                            std::string& out) const
{
  // Look for a target property defining the target output directory
  // based on the target type.
  std::string propertyName;
  if (!kind.empty()) {
    propertyName = cmStrCat(kind, "_OUTPUT_DIRECTORY");
  }
  std::string conf = config;

  // Check for a per-configuration output directory target property.
  std::string configUpper = cmSystemTools::UpperCase(conf);
  std::string configProp;
  if (!kind.empty()) {
    configProp = cmStrCat(kind, "_OUTPUT_DIRECTORY_", configUpper);
  }

  // Select an output directory.
  if (cmValue config_outdir = this->GetProperty(configProp)) {
    // Use the user-specified per-configuration output directory.
    out = cmGeneratorExpression::Evaluate(*config_outdir, this->LocalGenerator,
                                          config);

    // Skip per-configuration subdirectory.
    conf.clear();
  } else if (cmValue outdir = this->GetProperty(propertyName)) {
    // Use the user-specified output directory.
    out =
      cmGeneratorExpression::Evaluate(*outdir, this->LocalGenerator, config);

    // Skip per-configuration subdirectory if the value contained a
    // generator expression.
    if (out != *outdir) {
      conf.clear();
    }
  }
  if (out.empty()) {
    return false;
  }

  // Convert the output path to a full path in case it is
  // specified as a relative path.  Treat a relative path as
  // relative to the current output directory for this makefile.
  out = (cmSystemTools::CollapseFullPath(
    out, this->LocalGenerator->GetCurrentBinaryDirectory()));

  // The generator may add the configuration's subdirectory.
  if (!conf.empty()) {
    this->LocalGenerator->GetGlobalGenerator()->AppendDirectoryForConfig(
      "/", conf, "", out);
  }
  return true;
}